

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

int lj_gc_step_jit(global_State *g,MSize steps)

{
  lua_State *L_00;
  int iVar1;
  bool bVar2;
  bool local_22;
  lua_State *L;
  MSize steps_local;
  global_State *g_local;
  
  L_00 = (lua_State *)(g->cur_L).gcptr64;
  L_00->base = *(TValue **)((L_00->glref).ptr64 + 0x178);
  L_00->top = L_00->base +
              (int)(uint)*(byte *)(*(long *)((L_00->base[-2].u64 & 0x7fffffffffff) + 0x20) + -0x5d);
  L._4_4_ = steps;
  do {
    bVar2 = false;
    if (L._4_4_ != 0) {
      iVar1 = lj_gc_step(L_00);
      bVar2 = iVar1 == 0;
    }
    L._4_4_ = L._4_4_ - 1;
  } while (bVar2);
  local_22 = true;
  if (*(char *)((L_00->glref).ptr64 + 0x21) != '\x02') {
    local_22 = *(char *)((L_00->glref).ptr64 + 0x21) == '\x05';
  }
  return (int)local_22;
}

Assistant:

int LJ_FASTCALL lj_gc_step_jit(global_State *g, MSize steps)
{
  lua_State *L = gco2th(gcref(g->cur_L));
  L->base = tvref(G(L)->jit_base);
  L->top = curr_topL(L);
  while (steps-- > 0 && lj_gc_step(L) == 0)
    ;
  /* Return 1 to force a trace exit. */
  return (G(L)->gc.state == GCSatomic || G(L)->gc.state == GCSfinalize);
}